

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O1

void __thiscall wasm::RemoveUnusedBrs::optimizeSwitch(RemoveUnusedBrs *this,Switch *curr)

{
  ArenaVector<wasm::Name> *this_00;
  Name *pNVar1;
  size_t sVar2;
  char *pcVar3;
  Name *pNVar4;
  size_t sVar5;
  Index IVar6;
  Const *pCVar7;
  Binary *pBVar8;
  Drop *this_01;
  Break *pBVar9;
  Block *this_02;
  LocalSet *this_03;
  Expression *pEVar10;
  Break *pBVar11;
  If *this_04;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  Builder this_05;
  Type in_R8;
  int iVar16;
  ulong uVar17;
  MixedArena *this_06;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  optional<wasm::Type> type;
  Builder local_40;
  Builder builder;
  
  this_00 = &curr->targets;
  uVar13 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
  while ((uVar13 != 0 &&
         ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data
          [uVar13 - 1].super_IString.str._M_str == (curr->default_).super_IString.str._M_str))) {
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::pop_back
              (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    uVar13 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
    ;
  }
  if (uVar13 == 0) {
    uVar17 = 0;
  }
  else {
    uVar17 = 0;
    do {
      if ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data[uVar17].
          super_IString.str._M_str != (curr->default_).super_IString.str._M_str) break;
      uVar17 = (ulong)((int)uVar17 + 1);
    } while (uVar17 < uVar13);
  }
  iVar16 = (int)uVar17;
  if (iVar16 != 0) {
    uVar12 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
    ;
    uVar13 = uVar17;
    if (uVar17 < uVar12) {
      uVar14 = 0;
      do {
        uVar15 = (ulong)uVar14;
        if (uVar12 <= uVar15) goto LAB_00a92d4f;
        pNVar1 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
        in_R8.id = uVar15 * 0x10;
        pNVar4 = pNVar1 + uVar13;
        pcVar3 = (pNVar4->super_IString).str._M_str;
        pNVar1 = pNVar1 + uVar15;
        (pNVar1->super_IString).str._M_len = (pNVar4->super_IString).str._M_len;
        (pNVar1->super_IString).str._M_str = pcVar3;
        uVar13 = (ulong)(iVar16 + 1 + uVar14);
        uVar12 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                 usedElements;
        uVar14 = uVar14 + 1;
      } while (uVar13 < uVar12);
    }
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::resize
              (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,uVar12 - uVar17)
    ;
    local_40.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
         ).super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
         super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.currModule
    ;
    pEVar10 = curr->condition;
    builder.wasm = (Module *)this;
    pCVar7 = Builder::makeConst<int>(&local_40,iVar16);
    pBVar8 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar8->op = SubInt32;
    pBVar8->left = pEVar10;
    pBVar8->right = (Expression *)pCVar7;
    Binary::finalize(pBVar8);
    curr->condition = (Expression *)pBVar8;
    this = (RemoveUnusedBrs *)builder;
  }
  if (curr->value == (Expression *)0x0) {
    uVar17 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
    ;
    if (uVar17 == 1) {
      pEVar10 = curr->condition;
      sVar2 = (curr->default_).super_IString.str._M_len;
      pcVar3 = (curr->default_).super_IString.str._M_str;
      this_06 = &((Module *)(((Module *)this)->debugInfoSourceRoot)._M_string_length)->allocator;
      pBVar9 = (Break *)MixedArena::allocSpace(this_06,0x30,8);
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
      (pBVar9->name).super_IString.str._M_len = 0;
      (pBVar9->name).super_IString.str._M_str = (char *)0x0;
      pBVar9->value = (Expression *)0x0;
      pBVar9->condition = (Expression *)0x0;
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar9->name).super_IString.str._M_len = sVar2;
      (pBVar9->name).super_IString.str._M_str = pcVar3;
      pBVar9->value = (Expression *)0x0;
      pBVar9->condition = (Expression *)0x0;
      builder.wasm = (Module *)this;
      Break::finalize(pBVar9);
      if ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements ==
          0) {
LAB_00a92d6e:
        __assert_fail("usedElements > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xe3,
                      "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::front() const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                     );
      }
      this_05.wasm = (Module *)
                     &((builder.wasm)->tags).
                      super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pNVar4 = (this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).data;
      builder.wasm = (Module *)(pNVar4->super_IString).str._M_len;
      pcVar3 = (pNVar4->super_IString).str._M_str;
      pBVar11 = (Break *)MixedArena::allocSpace(this_06,0x30,8);
      (pBVar11->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar11->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
      (pBVar11->name).super_IString.str._M_len = 0;
      (pBVar11->name).super_IString.str._M_str = (char *)0x0;
      pBVar11->value = (Expression *)0x0;
      pBVar11->condition = (Expression *)0x0;
      (pBVar11->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar11->name).super_IString.str._M_len = (size_t)builder.wasm;
      (pBVar11->name).super_IString.str._M_str = pcVar3;
      pBVar11->value = (Expression *)0x0;
      pBVar11->condition = (Expression *)0x0;
      Break::finalize(pBVar11);
      uVar13 = 0x28;
      this_02 = (Block *)MixedArena::allocSpace(this_06,0x28,8);
      (this_02->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = IfId;
      (this_02->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (this_02->name).super_IString.str._M_len = (size_t)pEVar10;
      (this_02->name).super_IString.str._M_str = (char *)pBVar9;
      (this_02->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)pBVar11;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar13;
      If::finalize((If *)this_02,type_);
    }
    else if (uVar17 == 0) {
      local_40.wasm = (Module *)(((Module *)this)->debugInfoSourceRoot)._M_string_length;
      builder.wasm = (Module *)
                     &(((Module *)this)->tags).
                      super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pEVar10 = curr->condition;
      this_01 = (Drop *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
      (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      this_01->value = pEVar10;
      Drop::finalize(this_01);
      sVar2 = (curr->default_).super_IString.str._M_len;
      pcVar3 = (curr->default_).super_IString.str._M_str;
      pBVar9 = (Break *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x30,8);
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
      (pBVar9->name).super_IString.str._M_len = 0;
      (pBVar9->name).super_IString.str._M_str = (char *)0x0;
      pBVar9->value = (Expression *)0x0;
      pBVar9->condition = (Expression *)0x0;
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar9->name).super_IString.str._M_len = sVar2;
      (pBVar9->name).super_IString.str._M_str = pcVar3;
      pBVar9->value = (Expression *)0x0;
      pBVar9->condition = (Expression *)0x0;
      Break::finalize(pBVar9);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar13;
      this_02 = Builder::makeSequence(&local_40,(Expression *)this_01,(Expression *)pBVar9,type);
      this_05 = builder;
    }
    else {
      iVar16 = (((((WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                    *)&((Module *)this)->exports)->super_Pass).runner)->options).shrinkLevel;
      if ((uVar17 < 0xd || iVar16 < 1) && (uVar17 < 0x80 || 0 < iVar16)) {
        return;
      }
      if (1 < uVar17 - 1) {
        uVar13 = 2;
        uVar12 = 1;
        do {
          uVar15 = uVar13;
          if (uVar17 <= uVar12) {
LAB_00a92d4f:
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                         );
          }
          if ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data
              [uVar12].super_IString.str._M_str != (curr->default_).super_IString.str._M_str) {
            return;
          }
          uVar13 = (ulong)((int)uVar15 + 1);
          uVar12 = uVar15;
        } while (uVar15 < uVar17 - 1);
      }
      local_40.wasm = (Module *)(((Module *)this)->debugInfoSourceRoot)._M_string_length;
      builder.wasm = (Module *)this;
      IVar6 = Builder::addVar((Builder *)(((Module *)this)->debugInfoSourceRoot)._M_dataplus._M_p,
                              (Function *)0x0,(Name)(ZEXT816(2) << 0x40),in_R8);
      pEVar10 = curr->condition;
      this_03 = (LocalSet *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
      (this_03->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId
      ;
      (this_03->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
      this_03->index = IVar6;
      this_03->value = pEVar10;
      LocalSet::makeTee(this_03,(Type)0x2);
      pEVar10 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
      pEVar10->_id = LocalGetId;
      *(Index *)(pEVar10 + 1) = IVar6;
      (pEVar10->type).id = 2;
      pCVar7 = Builder::makeConst<int>
                         (&local_40,
                          (int)(curr->targets).
                               super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                               usedElements + -1);
      pBVar8 = (Binary *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
      (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar8->op = EqInt32;
      pBVar8->left = pEVar10;
      pBVar8->right = (Expression *)pCVar7;
      Binary::finalize(pBVar8);
      sVar2 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
              usedElements;
      if (sVar2 == 0) {
        __assert_fail("usedElements > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xd0,
                      "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::back() const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                     );
      }
      pNVar4 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
      sVar5 = pNVar4[sVar2 - 1].super_IString.str._M_len;
      pcVar3 = pNVar4[sVar2 - 1].super_IString.str._M_str;
      pBVar9 = (Break *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x30,8);
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
      (pBVar9->name).super_IString.str._M_len = 0;
      (pBVar9->name).super_IString.str._M_str = (char *)0x0;
      pBVar9->value = (Expression *)0x0;
      pBVar9->condition = (Expression *)0x0;
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar9->name).super_IString.str._M_len = sVar5;
      (pBVar9->name).super_IString.str._M_str = pcVar3;
      pBVar9->value = (Expression *)0x0;
      pBVar9->condition = (Expression *)0x0;
      Break::finalize(pBVar9);
      sVar2 = (curr->default_).super_IString.str._M_len;
      pcVar3 = (curr->default_).super_IString.str._M_str;
      pBVar11 = (Break *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x30,8);
      (pBVar11->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar11->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
      (pBVar11->name).super_IString.str._M_len = 0;
      (pBVar11->name).super_IString.str._M_str = (char *)0x0;
      pBVar11->value = (Expression *)0x0;
      pBVar11->condition = (Expression *)0x0;
      (pBVar11->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar11->name).super_IString.str._M_len = sVar2;
      (pBVar11->name).super_IString.str._M_str = pcVar3;
      pBVar11->value = (Expression *)0x0;
      pBVar11->condition = (Expression *)0x0;
      Break::finalize(pBVar11);
      uVar13 = 0x28;
      this_04 = (If *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
      (this_04->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
      (this_04->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
      this_04->condition = (Expression *)pBVar8;
      this_04->ifTrue = (Expression *)pBVar9;
      this_04->ifFalse = (Expression *)pBVar11;
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar13;
      If::finalize(this_04,type__00);
      if ((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements ==
          0) goto LAB_00a92d6e;
      this_05.wasm = (Module *)
                     &((builder.wasm)->tags).
                      super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pNVar4 = (this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>).data;
      sVar2 = (pNVar4->super_IString).str._M_len;
      pcVar3 = (pNVar4->super_IString).str._M_str;
      pBVar9 = (Break *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x30,8);
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
      (pBVar9->name).super_IString.str._M_len = 0;
      (pBVar9->name).super_IString.str._M_str = (char *)0x0;
      pBVar9->value = (Expression *)0x0;
      pBVar9->condition = (Expression *)0x0;
      (pBVar9->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
      (pBVar9->name).super_IString.str._M_len = sVar2;
      (pBVar9->name).super_IString.str._M_str = pcVar3;
      pBVar9->value = (Expression *)0x0;
      pBVar9->condition = (Expression *)0x0;
      Break::finalize(pBVar9);
      uVar13 = 0x28;
      this_02 = (Block *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
      (this_02->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = IfId;
      (this_02->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (this_02->name).super_IString.str._M_len = (size_t)this_03;
      (this_02->name).super_IString.str._M_str = (char *)this_04;
      (this_02->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)pBVar9;
      type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar13;
      If::finalize((If *)this_02,type__01);
    }
    Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::replaceCurrent
              ((Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *)
               this_05.wasm,(Expression *)this_02);
  }
  return;
}

Assistant:

void optimizeSwitch(Switch* curr) {
    // if the final element is the default, we don't need it
    while (!curr->targets.empty() && curr->targets.back() == curr->default_) {
      curr->targets.pop_back();
    }
    // if the first element is the default, we can remove it by shifting
    // everything (which does add a subtraction of a constant, but often that is
    // worth it as the constant can be folded away and/or we remove multiple
    // elements here)
    Index removable = 0;
    while (removable < curr->targets.size() &&
           curr->targets[removable] == curr->default_) {
      removable++;
    }
    if (removable > 0) {
      for (Index i = removable; i < curr->targets.size(); i++) {
        curr->targets[i - removable] = curr->targets[i];
      }
      curr->targets.resize(curr->targets.size() - removable);
      Builder builder(*getModule());
      curr->condition = builder.makeBinary(
        SubInt32, curr->condition, builder.makeConst(int32_t(removable)));
    }
    // when there isn't a value, we can do some trivial optimizations without
    // worrying about the value being executed before the condition
    if (curr->value) {
      return;
    }
    if (curr->targets.size() == 0) {
      // a switch with just a default always goes there
      Builder builder(*getModule());
      replaceCurrent(builder.makeSequence(builder.makeDrop(curr->condition),
                                          builder.makeBreak(curr->default_)));
    } else if (curr->targets.size() == 1) {
      // a switch with two options is basically an if
      Builder builder(*getModule());
      replaceCurrent(builder.makeIf(curr->condition,
                                    builder.makeBreak(curr->default_),
                                    builder.makeBreak(curr->targets.front())));
    } else {
      // there are also some other cases where we want to convert a switch into
      // ifs, especially if the switch is large and we are focusing on size. an
      // especially egregious case is a switch like this: [a b b [..] b b c]
      // with default b (which may be arrived at after we trim away excess
      // default values on both sides). in this case, we really have 3 values in
      // a simple form, so it is the next logical case after handling 1 and 2
      // values right above here. to optimize this, we must add a local + a
      // bunch of nodes (if*2, tee, eq, get, const, break*3), so the table must
      // be big enough for it to make sense

      // How many targets we need when shrinking. This is literally the size at
      // which the transformation begins to be smaller.
      const uint32_t MIN_SHRINK = 13;
      // How many targets we need when not shrinking, in which case, 2 ifs may
      // be slower, so we do this when the table is ridiculously large for one
      // with just 3 values in it.
      const uint32_t MIN_GENERAL = 128;

      auto shrink = getPassRunner()->options.shrinkLevel > 0;
      if ((curr->targets.size() >= MIN_SHRINK && shrink) ||
          (curr->targets.size() >= MIN_GENERAL && !shrink)) {
        for (Index i = 1; i < curr->targets.size() - 1; i++) {
          if (curr->targets[i] != curr->default_) {
            return;
          }
        }
        // great, we are in that case, optimize
        Builder builder(*getModule());
        auto temp = builder.addVar(getFunction(), Type::i32);
        Expression* z;
        replaceCurrent(z = builder.makeIf(
                         builder.makeLocalTee(temp, curr->condition, Type::i32),
                         builder.makeIf(builder.makeBinary(
                                          EqInt32,
                                          builder.makeLocalGet(temp, Type::i32),
                                          builder.makeConst(
                                            int32_t(curr->targets.size() - 1))),
                                        builder.makeBreak(curr->targets.back()),
                                        builder.makeBreak(curr->default_)),
                         builder.makeBreak(curr->targets.front())));
      }
    }
  }